

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void approxtest(void)

{
  double *x_00;
  double *y_00;
  double *x_01;
  double *yout_00;
  double *yout;
  double *xout;
  double *y;
  double *x;
  int Nout;
  int N;
  int i;
  
  x_00 = (double *)malloc(0x50);
  y_00 = (double *)malloc(0x50);
  for (Nout = 0; Nout < 10; Nout = Nout + 1) {
    x_00[Nout] = (double)(Nout + 1);
    y_00[Nout] = x_00[Nout] * x_00[Nout];
  }
  x_01 = (double *)malloc(400);
  yout_00 = (double *)malloc(400);
  linspace(x_01,0x32,*x_00,x_00[9]);
  approx(x_00,y_00,10,x_01,yout_00,0x32);
  mdisplay(x_01,1,0x32);
  mdisplay(yout_00,1,0x32);
  free(x_00);
  free(y_00);
  free(x_01);
  free(yout_00);
  return;
}

Assistant:

void approxtest() {
	int i,N, Nout;
	double *x,*y,*xout,*yout;

	N = 10;

	x = (double*) malloc(sizeof(double)*N);
	y = (double*) malloc(sizeof(double)*N);

	for(i = 0; i < N; ++i) {
		x[i] = (double) (i+1);
		y[i] = x[i] *x[i];
	}

	Nout = 50;

	xout = (double*) malloc(sizeof(double)*Nout);
	yout = (double*) malloc(sizeof(double)*Nout);

	linspace(xout,Nout,x[0],x[N-1]);

	/* x and y should be sorted in ascending order. x has all unique values
		xout contains equally spaced Nout values from lowest x[0]
		to highest x[N-1].Outputs y[out] are Nout interpolated values.
	*/

	approx(x,y,N,xout,yout,Nout);

	mdisplay(xout,1,Nout);
	mdisplay(yout,1,Nout);

	free(x);
	free(y);
	free(xout);
	free(yout);
}